

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int CustomSetup(VP8Io *io)

{
  WEBP_CSP_MODE mode;
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  VP8Io *in_RDI;
  int uv_width;
  int ok;
  int is_alpha;
  int is_rgb;
  WEBP_CSP_MODE colorspace;
  WebPDecParams *p;
  WebPDecParams *in_stack_00000040;
  VP8Io *in_stack_00000048;
  code *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 *puVar5;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  puVar5 = (undefined8 *)in_RDI->opaque;
  mode = *(WEBP_CSP_MODE *)*puVar5;
  iVar1 = WebPIsRGBMode(mode);
  iVar2 = WebPIsAlphaMode(MODE_RGB);
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0xc] = 0;
  puVar5[0xd] = 0;
  iVar3 = WebPIoInitFromOptions
                    ((WebPDecoderOptions *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     (WEBP_CSP_MODE)((ulong)puVar5 >> 0x20));
  if (iVar3 == 0) {
    iVar1 = 0;
  }
  else {
    if ((iVar2 != 0) && (iVar3 = WebPIsPremultipliedMode(mode), iVar3 != 0)) {
      WebPInitUpsamplers();
    }
    if (in_RDI->use_scaling == 0) {
      if (iVar1 == 0) {
        puVar5[0xb] = EmitYUV;
      }
      else {
        WebPInitSamplers();
        puVar5[0xb] = EmitSampledRGB;
        if (in_RDI->fancy_upsampling != 0) {
          iVar3 = in_RDI->mb_w + 1 >> 1;
          pvVar4 = WebPSafeMalloc(CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                                  CONCAT44(iVar3,in_stack_ffffffffffffffd0));
          puVar5[10] = pvVar4;
          if (puVar5[10] == 0) {
            return 0;
          }
          puVar5[1] = puVar5[10];
          puVar5[2] = puVar5[1] + (long)in_RDI->mb_w;
          puVar5[3] = puVar5[2] + (long)iVar3;
          puVar5[0xb] = EmitFancyRGB;
          WebPInitUpsamplers();
        }
      }
      if (iVar2 != 0) {
        if ((mode == MODE_RGBA_4444) || (mode == MODE_rgbA_4444)) {
          local_38 = EmitAlphaRGBA4444;
        }
        else {
          local_38 = EmitAlphaYUV;
          if (iVar1 != 0) {
            local_38 = EmitAlphaRGB;
          }
        }
        puVar5[0xc] = local_38;
        if (iVar1 != 0) {
          WebPInitAlphaProcessing();
        }
      }
    }
    else {
      if (iVar1 == 0) {
        iVar1 = InitYUVRescaler(in_stack_00000048,in_stack_00000040);
      }
      else {
        iVar1 = InitRGBRescaler(in_stack_00000048,in_stack_00000040);
      }
      if (iVar1 == 0) {
        return 0;
      }
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int CustomSetup(VP8Io* io) {
  WebPDecParams* const p = (WebPDecParams*)io->opaque;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int is_rgb = WebPIsRGBMode(colorspace);
  const int is_alpha = WebPIsAlphaMode(colorspace);

  p->memory = NULL;
  p->emit = NULL;
  p->emit_alpha = NULL;
  p->emit_alpha_row = NULL;
  if (!WebPIoInitFromOptions(p->options, io, is_alpha ? MODE_YUV : MODE_YUVA)) {
    return 0;
  }
  if (is_alpha && WebPIsPremultipliedMode(colorspace)) {
    WebPInitUpsamplers();
  }
  if (io->use_scaling) {
#if !defined(WEBP_REDUCE_SIZE)
    const int ok = is_rgb ? InitRGBRescaler(io, p) : InitYUVRescaler(io, p);
    if (!ok) {
      return 0;    // memory error
    }
#else
    return 0;   // rescaling support not compiled
#endif
  } else {
    if (is_rgb) {
      WebPInitSamplers();
      p->emit = EmitSampledRGB;   // default
      if (io->fancy_upsampling) {
#ifdef FANCY_UPSAMPLING
        const int uv_width = (io->mb_w + 1) >> 1;
        p->memory = WebPSafeMalloc(1ULL, (size_t)(io->mb_w + 2 * uv_width));
        if (p->memory == NULL) {
          return 0;   // memory error.
        }
        p->tmp_y = (uint8_t*)p->memory;
        p->tmp_u = p->tmp_y + io->mb_w;
        p->tmp_v = p->tmp_u + uv_width;
        p->emit = EmitFancyRGB;
        WebPInitUpsamplers();
#endif
      }
    } else {
      p->emit = EmitYUV;
    }
    if (is_alpha) {  // need transparency output
      p->emit_alpha =
          (colorspace == MODE_RGBA_4444 || colorspace == MODE_rgbA_4444) ?
              EmitAlphaRGBA4444
          : is_rgb ? EmitAlphaRGB
          : EmitAlphaYUV;
      if (is_rgb) {
        WebPInitAlphaProcessing();
      }
    }
  }

  return 1;
}